

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_channel_converter_get_heap_layout
                    (ma_channel_converter_config *pConfig,
                    ma_channel_converter_heap_layout *pHeapLayout)

{
  ma_bool32 mVar1;
  ma_channel_conversion_path mVar2;
  ulong *in_RSI;
  long in_RDI;
  ma_channel_conversion_path conversionPath;
  ma_channel *in_stack_ffffffffffffffd8;
  ma_result local_4;
  
  if (in_RDI == 0) {
    local_4 = MA_INVALID_ARGS;
  }
  else if ((*(int *)(in_RDI + 4) == 0) || (*(int *)(in_RDI + 8) == 0)) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    mVar1 = ma_channel_map_is_valid(in_stack_ffffffffffffffd8,0);
    if (mVar1 == 0) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      mVar1 = ma_channel_map_is_valid(in_stack_ffffffffffffffd8,0);
      if (mVar1 == 0) {
        local_4 = MA_INVALID_ARGS;
      }
      else {
        *in_RSI = 0;
        in_RSI[1] = *in_RSI;
        if (*(long *)(in_RDI + 0x10) != 0) {
          *in_RSI = (ulong)*(uint *)(in_RDI + 4) + *in_RSI;
        }
        in_RSI[2] = *in_RSI;
        if (*(long *)(in_RDI + 0x18) != 0) {
          *in_RSI = (ulong)*(uint *)(in_RDI + 8) + *in_RSI;
        }
        *in_RSI = *in_RSI + 7 & 0xfffffffffffffff8;
        mVar2 = ma_channel_converter_config_get_conversion_path
                          ((ma_channel_converter_config *)0x1d3b30);
        in_RSI[3] = *in_RSI;
        if (mVar2 == ma_channel_conversion_path_shuffle) {
          *in_RSI = (ulong)*(uint *)(in_RDI + 8) + *in_RSI;
        }
        in_RSI[4] = *in_RSI;
        if (mVar2 == ma_channel_conversion_path_weights) {
          *in_RSI = (ulong)*(uint *)(in_RDI + 4) * 8 + *in_RSI;
          *in_RSI = (ulong)*(uint *)(in_RDI + 4) * 4 * (ulong)*(uint *)(in_RDI + 8) + *in_RSI;
        }
        *in_RSI = *in_RSI + 7 & 0xfffffffffffffff8;
        local_4 = MA_SUCCESS;
      }
    }
  }
  return local_4;
}

Assistant:

static ma_result ma_channel_converter_get_heap_layout(const ma_channel_converter_config* pConfig, ma_channel_converter_heap_layout* pHeapLayout)
{
    ma_channel_conversion_path conversionPath;

    MA_ASSERT(pHeapLayout != NULL);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->channelsIn == 0 || pConfig->channelsOut == 0) {
        return MA_INVALID_ARGS;
    }

    if (!ma_channel_map_is_valid(pConfig->pChannelMapIn, pConfig->channelsIn)) {
        return MA_INVALID_ARGS;
    }

    if (!ma_channel_map_is_valid(pConfig->pChannelMapOut, pConfig->channelsOut)) {
        return MA_INVALID_ARGS;
    }

    pHeapLayout->sizeInBytes = 0;

    /* Input channel map. Only need to allocate this if we have an input channel map (otherwise default channel map is assumed). */
    pHeapLayout->channelMapInOffset = pHeapLayout->sizeInBytes;
    if (pConfig->pChannelMapIn != NULL) {
        pHeapLayout->sizeInBytes += sizeof(ma_channel) * pConfig->channelsIn;
    }

    /* Output channel map. Only need to allocate this if we have an output channel map (otherwise default channel map is assumed). */
    pHeapLayout->channelMapOutOffset = pHeapLayout->sizeInBytes;
    if (pConfig->pChannelMapOut != NULL) {
        pHeapLayout->sizeInBytes += sizeof(ma_channel) * pConfig->channelsOut;
    }

    /* Alignment for the next section. */
    pHeapLayout->sizeInBytes = ma_align_64(pHeapLayout->sizeInBytes);

    /* Whether or not we use weights of a shuffle table depends on the channel map themselves and the algorithm we've chosen. */
    conversionPath = ma_channel_converter_config_get_conversion_path(pConfig);

    /* Shuffle table */
    pHeapLayout->shuffleTableOffset = pHeapLayout->sizeInBytes;
    if (conversionPath == ma_channel_conversion_path_shuffle) {
        pHeapLayout->sizeInBytes += sizeof(ma_uint8) * pConfig->channelsOut;
    }

    /* Weights */
    pHeapLayout->weightsOffset = pHeapLayout->sizeInBytes;
    if (conversionPath == ma_channel_conversion_path_weights) {
        pHeapLayout->sizeInBytes += sizeof(float*) * pConfig->channelsIn;
        pHeapLayout->sizeInBytes += sizeof(float ) * pConfig->channelsIn * pConfig->channelsOut;
    }

    /* Make sure allocation size is aligned. */
    pHeapLayout->sizeInBytes = ma_align_64(pHeapLayout->sizeInBytes);

    return MA_SUCCESS;
}